

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# round2.hpp
# Opt level: O2

uint32_t pstore::round_to_power_of_2(uint32_t v)

{
  uint uVar1;
  
  uVar1 = v - 1 >> 1 | v - 1;
  uVar1 = uVar1 >> 2 | uVar1;
  uVar1 = uVar1 >> 4 | uVar1;
  uVar1 = uVar1 >> 8 | uVar1;
  return (uVar1 >> 0x10 | uVar1) + 1;
}

Assistant:

inline std::uint32_t round_to_power_of_2 (std::uint32_t v) noexcept {
        --v;
        v |= v >> 1;
        v |= v >> 2;
        v |= v >> 4;
        v |= v >> 8;
        v |= v >> 16;
        ++v;
        return v;
    }